

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsignalmapper.cpp
# Opt level: O1

void QSignalMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QSignalMapper_to_subr *candidate;
  QObject *sender;
  undefined4 uVar2;
  int iVar3;
  QSignalMapperPrivate *this;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((code *)*plVar1 == mappedInt) && (uVar2 = 0, plVar1[1] == 0)) ||
        (((code *)*plVar1 == mappedString && (uVar2 = 1, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == mappedObject && (uVar2 = 2, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_002c7be1;
  }
  if (_c != InvokeMetaMethod) goto LAB_002c7be1;
  switch(_id) {
  case 0:
    puStack_30 = &local_40;
    local_40 = CONCAT44(local_40._4_4_,*_a[1]);
    iVar3 = 0;
    break;
  case 1:
    puStack_30 = (undefined8 *)_a[1];
    iVar3 = 1;
    break;
  case 2:
    local_40 = *_a[1];
    puStack_30 = &local_40;
    iVar3 = 2;
    break;
  case 3:
    sender = QObject::sender(_o);
    this = (QSignalMapperPrivate *)(_o->d_ptr).d;
    goto LAB_002c7b55;
  case 4:
    sender = *_a[1];
    this = (QSignalMapperPrivate *)(_o->d_ptr).d;
LAB_002c7b55:
    QSignalMapperPrivate::emitMappedValues(this,sender);
  default:
    goto LAB_002c7be1;
  }
  local_38 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_38);
LAB_002c7be1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSignalMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSignalMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->mappedInt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->mappedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->mappedObject((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 3: _t->map(); break;
        case 4: _t->map((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(int )>(_a, &QSignalMapper::mappedInt, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(const QString & )>(_a, &QSignalMapper::mappedString, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(QObject * )>(_a, &QSignalMapper::mappedObject, 2))
            return;
    }
}